

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O2

void ZIP_destroy(PHYSFS_Io *io)

{
  long *plVar1;
  
  plVar1 = (long *)io->opaque;
  (**(code **)(plVar1[1] + 0x48))();
  if (*(short *)(*plVar1 + 0x46) != 0) {
    mz_inflateEnd((mz_streamp)(plVar1 + 7));
  }
  if ((void *)plVar1[3] != (void *)0x0) {
    (*__PHYSFS_AllocatorHooks.Free)((void *)plVar1[3]);
  }
  (*__PHYSFS_AllocatorHooks.Free)(plVar1);
  (*__PHYSFS_AllocatorHooks.Free)(io);
  return;
}

Assistant:

static void ZIP_destroy(PHYSFS_Io *io)
{
    ZIPfileinfo *finfo = (ZIPfileinfo *) io->opaque;
    finfo->io->destroy(finfo->io);

    if (finfo->entry->compression_method != COMPMETH_NONE)
        inflateEnd(&finfo->stream);

    if (finfo->buffer != NULL)
        allocator.Free(finfo->buffer);

    allocator.Free(finfo);
    allocator.Free(io);
}